

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_EmptyBuilder::_Test_EmptyBuilder(_Test_EmptyBuilder *this)

{
  _Test_EmptyBuilder *this_local;
  
  FilterBlockTest::FilterBlockTest(&this->super_FilterBlockTest);
  return;
}

Assistant:

TEST(FilterBlockTest, EmptyBuilder) {
  FilterBlockBuilder builder(&policy_);
  Slice block = builder.Finish();
  ASSERT_EQ("\\x00\\x00\\x00\\x00\\x0b", EscapeString(block));
  FilterBlockReader reader(&policy_, block);
  ASSERT_TRUE(reader.KeyMayMatch(0, "foo"));
  ASSERT_TRUE(reader.KeyMayMatch(100000, "foo"));
}